

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RestraintForceModifier.cpp
# Opt level: O0

RealType __thiscall
OpenMD::RestraintForceModifier::doRestraints(RestraintForceModifier *this,RealType scalingFactor)

{
  bool bVar1;
  element_type *peVar2;
  Restraint **ppRVar3;
  reference ppSVar4;
  long in_RDI;
  RealType in_XMM0_Qa;
  RealType RVar5;
  double dVar6;
  Vector3d *in_stack_00000220;
  vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_> *in_stack_00000228;
  RotMat3x3d A;
  Vector3d pos;
  shared_ptr<OpenMD::SimpleTypeData<OpenMD::Restraint_*>_> restData_1;
  int index;
  vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_> forces;
  vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_> struc;
  Vector3d molCom;
  shared_ptr<OpenMD::SimpleTypeData<OpenMD::Restraint_*>_> restData;
  map<int,_std::pair<double,_double>,_std::less<int>,_std::allocator<std::pair<const_int,_std::pair<double,_double>_>_>_>
  restInfo;
  const_iterator ro;
  StuntDouble *sd;
  ObjectRestraint *oRest;
  MolecularRestraint *mRest;
  IntegrableObjectIterator ioi;
  shared_ptr<OpenMD::GenericData> data;
  const_iterator rm;
  ObjectRestraint *in_stack_fffffffffffffb28;
  StuntDouble *in_stack_fffffffffffffb30;
  Molecule *in_stack_fffffffffffffb38;
  StuntDouble *in_stack_fffffffffffffb40;
  undefined7 in_stack_fffffffffffffb48;
  undefined1 in_stack_fffffffffffffb4f;
  Molecule *in_stack_fffffffffffffb50;
  Restraint *in_stack_fffffffffffffb60;
  StuntDouble *in_stack_fffffffffffffb68;
  StuntDouble *in_stack_fffffffffffffb70;
  vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
  *in_stack_fffffffffffffb78;
  undefined7 in_stack_fffffffffffffb80;
  undefined1 in_stack_fffffffffffffb87;
  Molecule *in_stack_fffffffffffffb88;
  errorStruct *peVar7;
  Restraint *local_460;
  Restraint *in_stack_fffffffffffffc38;
  ObjectRestraint *in_stack_fffffffffffffc40;
  undefined1 local_398 [360];
  string local_230 [48];
  StuntDouble **local_200;
  StuntDouble **local_1f8;
  StuntDouble **local_1f0;
  RotMat3x3d *in_stack_fffffffffffffe40;
  Vector3d *in_stack_fffffffffffffe48;
  ObjectRestraint *in_stack_fffffffffffffe50;
  int local_19c;
  vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_> local_138 [4];
  allocator<char> local_c9;
  string local_c8 [48];
  Molecule **local_98;
  Molecule **local_90;
  Molecule **local_88;
  undefined1 local_80 [48];
  __normal_iterator<OpenMD::StuntDouble_*const_*,_std::vector<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>_>
  local_50;
  StuntDouble *local_48;
  Restraint *local_40;
  Restraint *local_38;
  __normal_iterator<OpenMD::StuntDouble_**,_std::vector<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>_>
  local_30 [3];
  __normal_iterator<OpenMD::Molecule_*const_*,_std::vector<OpenMD::Molecule_*,_std::allocator<OpenMD::Molecule_*>_>_>
  local_18;
  RealType local_10;
  
  local_10 = in_XMM0_Qa;
  __gnu_cxx::
  __normal_iterator<OpenMD::Molecule_*const_*,_std::vector<OpenMD::Molecule_*,_std::allocator<OpenMD::Molecule_*>_>_>
  ::__normal_iterator(&local_18);
  std::shared_ptr<OpenMD::GenericData>::shared_ptr((shared_ptr<OpenMD::GenericData> *)0x19d762);
  __gnu_cxx::
  __normal_iterator<OpenMD::StuntDouble_**,_std::vector<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>_>
  ::__normal_iterator(local_30);
  local_38 = (Restraint *)0x0;
  local_40 = (Restraint *)0x0;
  __gnu_cxx::
  __normal_iterator<OpenMD::StuntDouble_*const_*,_std::vector<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>_>
  ::__normal_iterator(&local_50);
  std::
  map<int,_std::pair<double,_double>,_std::less<int>,_std::allocator<std::pair<const_int,_std::pair<double,_double>_>_>_>
  ::map((map<int,_std::pair<double,_double>,_std::less<int>,_std::allocator<std::pair<const_int,_std::pair<double,_double>_>_>_>
         *)0x19d7a1);
  *(undefined8 *)(in_RDI + 0x58) = 0;
  std::
  vector<std::map<int,_std::pair<double,_double>,_std::less<int>,_std::allocator<std::pair<const_int,_std::pair<double,_double>_>_>_>,_std::allocator<std::map<int,_std::pair<double,_double>,_std::less<int>,_std::allocator<std::pair<const_int,_std::pair<double,_double>_>_>_>_>_>
  ::clear((vector<std::map<int,_std::pair<double,_double>,_std::less<int>,_std::allocator<std::pair<const_int,_std::pair<double,_double>_>_>_>,_std::allocator<std::map<int,_std::pair<double,_double>,_std::less<int>,_std::allocator<std::pair<const_int,_std::pair<double,_double>_>_>_>_>_>
           *)0x19d7ba);
  local_90 = (Molecule **)
             std::vector<OpenMD::Molecule_*,_std::allocator<OpenMD::Molecule_*>_>::begin
                       ((vector<OpenMD::Molecule_*,_std::allocator<OpenMD::Molecule_*>_> *)
                        in_stack_fffffffffffffb28);
  __gnu_cxx::
  __normal_iterator<OpenMD::Molecule*const*,std::vector<OpenMD::Molecule*,std::allocator<OpenMD::Molecule*>>>
  ::__normal_iterator<OpenMD::Molecule**>
            ((__normal_iterator<OpenMD::Molecule_*const_*,_std::vector<OpenMD::Molecule_*,_std::allocator<OpenMD::Molecule_*>_>_>
              *)in_stack_fffffffffffffb30,
             (__normal_iterator<OpenMD::Molecule_**,_std::vector<OpenMD::Molecule_*,_std::allocator<OpenMD::Molecule_*>_>_>
              *)in_stack_fffffffffffffb28);
  local_18._M_current = local_88;
  while( true ) {
    local_98 = (Molecule **)
               std::vector<OpenMD::Molecule_*,_std::allocator<OpenMD::Molecule_*>_>::end
                         ((vector<OpenMD::Molecule_*,_std::allocator<OpenMD::Molecule_*>_> *)
                          in_stack_fffffffffffffb28);
    bVar1 = __gnu_cxx::operator!=
                      ((__normal_iterator<OpenMD::Molecule_*const_*,_std::vector<OpenMD::Molecule_*,_std::allocator<OpenMD::Molecule_*>_>_>
                        *)in_stack_fffffffffffffb30,
                       (__normal_iterator<OpenMD::Molecule_**,_std::vector<OpenMD::Molecule_*,_std::allocator<OpenMD::Molecule_*>_>_>
                        *)in_stack_fffffffffffffb28);
    if (!bVar1) break;
    __gnu_cxx::
    __normal_iterator<OpenMD::Molecule_*const_*,_std::vector<OpenMD::Molecule_*,_std::allocator<OpenMD::Molecule_*>_>_>
    ::operator*(&local_18);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffffb70,(char *)in_stack_fffffffffffffb68,
               (allocator<char> *)in_stack_fffffffffffffb60);
    Molecule::getPropertyByName(in_stack_fffffffffffffb38,(string *)in_stack_fffffffffffffb30);
    std::shared_ptr<OpenMD::GenericData>::operator=
              ((shared_ptr<OpenMD::GenericData> *)in_stack_fffffffffffffb30,
               (shared_ptr<OpenMD::GenericData> *)in_stack_fffffffffffffb28);
    std::shared_ptr<OpenMD::GenericData>::~shared_ptr((shared_ptr<OpenMD::GenericData> *)0x19d8bb);
    std::__cxx11::string::~string(local_c8);
    std::allocator<char>::~allocator(&local_c9);
    bVar1 = std::operator!=((shared_ptr<OpenMD::GenericData> *)in_stack_fffffffffffffb30,
                            in_stack_fffffffffffffb28);
    if (bVar1) {
      std::dynamic_pointer_cast<OpenMD::SimpleTypeData<OpenMD::Restraint*>,OpenMD::GenericData>
                ((shared_ptr<OpenMD::GenericData> *)
                 CONCAT17(in_stack_fffffffffffffb4f,in_stack_fffffffffffffb48));
      bVar1 = std::operator!=((shared_ptr<OpenMD::SimpleTypeData<OpenMD::Restraint_*>_> *)
                              in_stack_fffffffffffffb30,in_stack_fffffffffffffb28);
      if (bVar1) {
        peVar2 = std::
                 __shared_ptr_access<OpenMD::SimpleTypeData<OpenMD::Restraint_*>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 ::operator->((__shared_ptr_access<OpenMD::SimpleTypeData<OpenMD::Restraint_*>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)0x19d92b);
        ppRVar3 = SimpleTypeData<OpenMD::Restraint_*>::getData(peVar2);
        in_stack_fffffffffffffc40 = (ObjectRestraint *)*ppRVar3;
        if (in_stack_fffffffffffffc40 == (ObjectRestraint *)0x0) {
          in_stack_fffffffffffffc38 = (Restraint *)0x0;
        }
        else {
          in_stack_fffffffffffffc38 =
               (Restraint *)
               __dynamic_cast(in_stack_fffffffffffffc40,&Restraint::typeinfo,
                              &MolecularRestraint::typeinfo,0);
        }
        local_38 = in_stack_fffffffffffffc38;
        if (in_stack_fffffffffffffc38 == (Restraint *)0x0) {
          snprintf(painCave.errMsg,2000,"Can not cast RestraintData to MolecularRestraint\n");
          painCave.severity = 1;
          painCave.isFatal = 1;
          simError();
        }
      }
      else {
        snprintf(painCave.errMsg,2000,"Can not cast GenericData to RestraintData\n");
        painCave.severity = 1;
        painCave.isFatal = 1;
        simError();
      }
      std::shared_ptr<OpenMD::SimpleTypeData<OpenMD::Restraint_*>_>::~shared_ptr
                ((shared_ptr<OpenMD::SimpleTypeData<OpenMD::Restraint_*>_> *)0x19dab6);
    }
    else {
      snprintf(painCave.errMsg,2000,"Can not find Restraint for RestrainedObject\n");
      painCave.severity = 1;
      painCave.isFatal = 1;
      simError();
    }
    __gnu_cxx::
    __normal_iterator<OpenMD::Molecule_*const_*,_std::vector<OpenMD::Molecule_*,_std::allocator<OpenMD::Molecule_*>_>_>
    ::operator*(&local_18);
    Molecule::getCom(in_stack_fffffffffffffb88);
    std::vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>::vector
              ((vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_> *)
               0x19db44);
    std::vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>::vector
              ((vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_> *)
               0x19db51);
    __gnu_cxx::
    __normal_iterator<OpenMD::Molecule_*const_*,_std::vector<OpenMD::Molecule_*,_std::allocator<OpenMD::Molecule_*>_>_>
    ::operator*(&local_18);
    local_48 = Molecule::beginIntegrableObject
                         (in_stack_fffffffffffffb50,
                          (iterator *)CONCAT17(in_stack_fffffffffffffb4f,in_stack_fffffffffffffb48))
    ;
    while (local_48 != (StuntDouble *)0x0) {
      StuntDouble::getPos((StuntDouble *)in_stack_fffffffffffffb38);
      std::vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>::push_back
                ((vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_> *)
                 in_stack_fffffffffffffb30,(value_type *)in_stack_fffffffffffffb28);
      __gnu_cxx::
      __normal_iterator<OpenMD::Molecule_*const_*,_std::vector<OpenMD::Molecule_*,_std::allocator<OpenMD::Molecule_*>_>_>
      ::operator*(&local_18);
      local_48 = Molecule::nextIntegrableObject
                           (in_stack_fffffffffffffb50,
                            (iterator *)
                            CONCAT17(in_stack_fffffffffffffb4f,in_stack_fffffffffffffb48));
    }
    Restraint::setScaleFactor(local_38,local_10);
    std::vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>::vector
              ((vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_> *)
               CONCAT17(in_stack_fffffffffffffb87,in_stack_fffffffffffffb80),
               in_stack_fffffffffffffb78);
    Vector3<double>::Vector3
              ((Vector3<double> *)in_stack_fffffffffffffb30,
               (Vector3<double> *)in_stack_fffffffffffffb28);
    MolecularRestraint::calcForce
              ((MolecularRestraint *)
               A.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[0][0],
               in_stack_00000228,in_stack_00000220);
    std::vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>::~vector
              ((vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_> *)
               in_stack_fffffffffffffb40);
    MolecularRestraint::getRestraintForces((MolecularRestraint *)in_stack_fffffffffffffb28);
    std::vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>::operator=
              ((vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_> *)
               in_stack_fffffffffffffb40,
               (vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_> *)
               in_stack_fffffffffffffb38);
    std::vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>::~vector
              ((vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_> *)
               in_stack_fffffffffffffb40);
    local_19c = 0;
    __gnu_cxx::
    __normal_iterator<OpenMD::Molecule_*const_*,_std::vector<OpenMD::Molecule_*,_std::allocator<OpenMD::Molecule_*>_>_>
    ::operator*(&local_18);
    local_48 = Molecule::beginIntegrableObject
                         (in_stack_fffffffffffffb50,
                          (iterator *)CONCAT17(in_stack_fffffffffffffb4f,in_stack_fffffffffffffb48))
    ;
    while (local_48 != (StuntDouble *)0x0) {
      std::vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>::operator[]
                (local_138,(long)local_19c);
      StuntDouble::addFrc(in_stack_fffffffffffffb40,(Vector3d *)in_stack_fffffffffffffb38);
      StuntDouble::getPos((StuntDouble *)in_stack_fffffffffffffb38);
      std::vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>::push_back
                ((vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_> *)
                 in_stack_fffffffffffffb30,(value_type *)in_stack_fffffffffffffb28);
      local_19c = local_19c + 1;
      __gnu_cxx::
      __normal_iterator<OpenMD::Molecule_*const_*,_std::vector<OpenMD::Molecule_*,_std::allocator<OpenMD::Molecule_*>_>_>
      ::operator*(&local_18);
      local_48 = Molecule::nextIntegrableObject
                           (in_stack_fffffffffffffb50,
                            (iterator *)
                            CONCAT17(in_stack_fffffffffffffb4f,in_stack_fffffffffffffb48));
    }
    RVar5 = Restraint::getUnscaledPotential(local_38);
    *(double *)(in_RDI + 0x58) = *(double *)(in_RDI + 0x58) + RVar5;
    bVar1 = Restraint::getPrintRestraint(local_38);
    if (bVar1) {
      Restraint::getRestraintInfo(&in_stack_fffffffffffffb28->super_Restraint);
      std::
      map<int,_std::pair<double,_double>,_std::less<int>,_std::allocator<std::pair<const_int,_std::pair<double,_double>_>_>_>
      ::operator=((map<int,_std::pair<double,_double>,_std::less<int>,_std::allocator<std::pair<const_int,_std::pair<double,_double>_>_>_>
                   *)in_stack_fffffffffffffb30,
                  (map<int,_std::pair<double,_double>,_std::less<int>,_std::allocator<std::pair<const_int,_std::pair<double,_double>_>_>_>
                   *)in_stack_fffffffffffffb28);
      std::
      map<int,_std::pair<double,_double>,_std::less<int>,_std::allocator<std::pair<const_int,_std::pair<double,_double>_>_>_>
      ::~map((map<int,_std::pair<double,_double>,_std::less<int>,_std::allocator<std::pair<const_int,_std::pair<double,_double>_>_>_>
              *)0x19dea8);
      std::
      vector<std::map<int,_std::pair<double,_double>,_std::less<int>,_std::allocator<std::pair<const_int,_std::pair<double,_double>_>_>_>,_std::allocator<std::map<int,_std::pair<double,_double>,_std::less<int>,_std::allocator<std::pair<const_int,_std::pair<double,_double>_>_>_>_>_>
      ::push_back((vector<std::map<int,_std::pair<double,_double>,_std::less<int>,_std::allocator<std::pair<const_int,_std::pair<double,_double>_>_>_>,_std::allocator<std::map<int,_std::pair<double,_double>,_std::less<int>,_std::allocator<std::pair<const_int,_std::pair<double,_double>_>_>_>_>_>
                   *)in_stack_fffffffffffffb40,(value_type *)in_stack_fffffffffffffb38);
    }
    std::vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>::~vector
              ((vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_> *)
               in_stack_fffffffffffffb40);
    std::vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>::~vector
              ((vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_> *)
               in_stack_fffffffffffffb40);
    __gnu_cxx::
    __normal_iterator<OpenMD::Molecule_*const_*,_std::vector<OpenMD::Molecule_*,_std::allocator<OpenMD::Molecule_*>_>_>
    ::operator++(&local_18);
  }
  local_1f8 = (StuntDouble **)
              std::vector<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>::begin
                        ((vector<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_> *)
                         in_stack_fffffffffffffb28);
  __gnu_cxx::
  __normal_iterator<OpenMD::StuntDouble*const*,std::vector<OpenMD::StuntDouble*,std::allocator<OpenMD::StuntDouble*>>>
  ::__normal_iterator<OpenMD::StuntDouble**>
            ((__normal_iterator<OpenMD::StuntDouble_*const_*,_std::vector<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>_>
              *)in_stack_fffffffffffffb30,
             (__normal_iterator<OpenMD::StuntDouble_**,_std::vector<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>_>
              *)in_stack_fffffffffffffb28);
  local_50._M_current = local_1f0;
  while( true ) {
    local_200 = (StuntDouble **)
                std::vector<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>::end
                          ((vector<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_> *)
                           in_stack_fffffffffffffb28);
    bVar1 = __gnu_cxx::operator!=
                      ((__normal_iterator<OpenMD::StuntDouble_*const_*,_std::vector<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>_>
                        *)in_stack_fffffffffffffb30,
                       (__normal_iterator<OpenMD::StuntDouble_**,_std::vector<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>_>
                        *)in_stack_fffffffffffffb28);
    if (!bVar1) break;
    __gnu_cxx::
    __normal_iterator<OpenMD::StuntDouble_*const_*,_std::vector<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>_>
    ::operator*(&local_50);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffffb70,(char *)in_stack_fffffffffffffb68,
               (allocator<char> *)in_stack_fffffffffffffb60);
    StuntDouble::getPropertyByName
              ((StuntDouble *)in_stack_fffffffffffffb38,(string *)in_stack_fffffffffffffb30);
    std::shared_ptr<OpenMD::GenericData>::operator=
              ((shared_ptr<OpenMD::GenericData> *)in_stack_fffffffffffffb30,
               (shared_ptr<OpenMD::GenericData> *)in_stack_fffffffffffffb28);
    std::shared_ptr<OpenMD::GenericData>::~shared_ptr((shared_ptr<OpenMD::GenericData> *)0x19e011);
    std::__cxx11::string::~string(local_230);
    std::allocator<char>::~allocator((allocator<char> *)(local_398 + 0x167));
    bVar1 = std::operator!=((shared_ptr<OpenMD::GenericData> *)in_stack_fffffffffffffb30,
                            in_stack_fffffffffffffb28);
    if (bVar1) {
      std::dynamic_pointer_cast<OpenMD::SimpleTypeData<OpenMD::Restraint*>,OpenMD::GenericData>
                ((shared_ptr<OpenMD::GenericData> *)
                 CONCAT17(in_stack_fffffffffffffb4f,in_stack_fffffffffffffb48));
      bVar1 = std::operator!=((shared_ptr<OpenMD::SimpleTypeData<OpenMD::Restraint_*>_> *)
                              in_stack_fffffffffffffb30,in_stack_fffffffffffffb28);
      if (bVar1) {
        peVar2 = std::
                 __shared_ptr_access<OpenMD::SimpleTypeData<OpenMD::Restraint_*>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 ::operator->((__shared_ptr_access<OpenMD::SimpleTypeData<OpenMD::Restraint_*>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)0x19e081);
        ppRVar3 = SimpleTypeData<OpenMD::Restraint_*>::getData(peVar2);
        if (*ppRVar3 == (Restraint *)0x0) {
          local_460 = (Restraint *)0x0;
        }
        else {
          local_460 = (Restraint *)
                      __dynamic_cast(*ppRVar3,&Restraint::typeinfo,&ObjectRestraint::typeinfo,0);
        }
        local_40 = local_460;
        if (local_460 == (Restraint *)0x0) {
          snprintf(painCave.errMsg,2000,"Can not cast RestraintData to ObjectRestraint\n");
          painCave.severity = 1;
          painCave.isFatal = 1;
          simError();
        }
      }
      else {
        snprintf(painCave.errMsg,2000,"Can not cast GenericData to RestraintData\n");
        painCave.severity = 1;
        painCave.isFatal = 1;
        simError();
      }
      std::shared_ptr<OpenMD::SimpleTypeData<OpenMD::Restraint_*>_>::~shared_ptr
                ((shared_ptr<OpenMD::SimpleTypeData<OpenMD::Restraint_*>_> *)0x19e1f7);
    }
    else {
      peVar7 = &painCave;
      snprintf(painCave.errMsg,2000,"Can not find Restraint for RestrainedObject\n");
      peVar7->severity = 1;
      peVar7->isFatal = 1;
      simError();
    }
    Restraint::setScaleFactor(local_40,local_10);
    __gnu_cxx::
    __normal_iterator<OpenMD::StuntDouble_*const_*,_std::vector<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>_>
    ::operator*(&local_50);
    StuntDouble::getPos((StuntDouble *)in_stack_fffffffffffffb38);
    __gnu_cxx::
    __normal_iterator<OpenMD::StuntDouble_*const_*,_std::vector<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>_>
    ::operator*(&local_50);
    bVar1 = StuntDouble::isDirectional(in_stack_fffffffffffffb30);
    if (bVar1) {
      __gnu_cxx::
      __normal_iterator<OpenMD::StuntDouble_*const_*,_std::vector<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>_>
      ::operator*(&local_50);
      StuntDouble::getA((StuntDouble *)in_stack_fffffffffffffb38);
      Vector3<double>::Vector3
                ((Vector3<double> *)in_stack_fffffffffffffb30,
                 (Vector3<double> *)in_stack_fffffffffffffb28);
      SquareMatrix3<double>::SquareMatrix3
                ((SquareMatrix3<double> *)in_stack_fffffffffffffb30,
                 (SquareMatrix3<double> *)in_stack_fffffffffffffb28);
      ObjectRestraint::calcForce
                (in_stack_fffffffffffffe50,in_stack_fffffffffffffe48,in_stack_fffffffffffffe40);
      SquareMatrix3<double>::~SquareMatrix3((SquareMatrix3<double> *)0x19e31c);
      ppSVar4 = __gnu_cxx::
                __normal_iterator<OpenMD::StuntDouble_*const_*,_std::vector<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>_>
                ::operator*(&local_50);
      in_stack_fffffffffffffb70 = *ppSVar4;
      ObjectRestraint::getRestraintForce(in_stack_fffffffffffffb28);
      StuntDouble::addFrc(in_stack_fffffffffffffb40,(Vector3d *)in_stack_fffffffffffffb38);
      ppSVar4 = __gnu_cxx::
                __normal_iterator<OpenMD::StuntDouble_*const_*,_std::vector<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>_>
                ::operator*(&local_50);
      in_stack_fffffffffffffb68 = *ppSVar4;
      ObjectRestraint::getRestraintTorque(in_stack_fffffffffffffb28);
      StuntDouble::addTrq(in_stack_fffffffffffffb40,(Vector3d *)in_stack_fffffffffffffb38);
      SquareMatrix3<double>::~SquareMatrix3((SquareMatrix3<double> *)0x19e3a9);
    }
    else {
      in_stack_fffffffffffffb60 = local_40;
      Vector3<double>::Vector3
                ((Vector3<double> *)in_stack_fffffffffffffb30,
                 (Vector3<double> *)in_stack_fffffffffffffb28);
      ObjectRestraint::calcForce(in_stack_fffffffffffffc40,(Vector3d *)in_stack_fffffffffffffc38);
      __gnu_cxx::
      __normal_iterator<OpenMD::StuntDouble_*const_*,_std::vector<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>_>
      ::operator*(&local_50);
      ObjectRestraint::getRestraintForce(in_stack_fffffffffffffb28);
      StuntDouble::addFrc(in_stack_fffffffffffffb40,(Vector3d *)in_stack_fffffffffffffb38);
    }
    RVar5 = Restraint::getUnscaledPotential(local_40);
    *(double *)(in_RDI + 0x58) = *(double *)(in_RDI + 0x58) + RVar5;
    in_stack_fffffffffffffb4f = Restraint::getPrintRestraint(local_40);
    if ((bool)in_stack_fffffffffffffb4f) {
      Restraint::getRestraintInfo(&in_stack_fffffffffffffb28->super_Restraint);
      in_stack_fffffffffffffb40 = (StuntDouble *)local_80;
      in_stack_fffffffffffffb38 = (Molecule *)local_398;
      std::
      map<int,_std::pair<double,_double>,_std::less<int>,_std::allocator<std::pair<const_int,_std::pair<double,_double>_>_>_>
      ::operator=((map<int,_std::pair<double,_double>,_std::less<int>,_std::allocator<std::pair<const_int,_std::pair<double,_double>_>_>_>
                   *)in_stack_fffffffffffffb30,
                  (map<int,_std::pair<double,_double>,_std::less<int>,_std::allocator<std::pair<const_int,_std::pair<double,_double>_>_>_>
                   *)in_stack_fffffffffffffb28);
      std::
      map<int,_std::pair<double,_double>,_std::less<int>,_std::allocator<std::pair<const_int,_std::pair<double,_double>_>_>_>
      ::~map((map<int,_std::pair<double,_double>,_std::less<int>,_std::allocator<std::pair<const_int,_std::pair<double,_double>_>_>_>
              *)0x19e4ff);
      std::
      vector<std::map<int,_std::pair<double,_double>,_std::less<int>,_std::allocator<std::pair<const_int,_std::pair<double,_double>_>_>_>,_std::allocator<std::map<int,_std::pair<double,_double>,_std::less<int>,_std::allocator<std::pair<const_int,_std::pair<double,_double>_>_>_>_>_>
      ::push_back((vector<std::map<int,_std::pair<double,_double>,_std::less<int>,_std::allocator<std::pair<const_int,_std::pair<double,_double>_>_>_>,_std::allocator<std::map<int,_std::pair<double,_double>,_std::less<int>,_std::allocator<std::pair<const_int,_std::pair<double,_double>_>_>_>_>_>
                   *)in_stack_fffffffffffffb40,(value_type *)in_stack_fffffffffffffb38);
    }
    __gnu_cxx::
    __normal_iterator<OpenMD::StuntDouble_*const_*,_std::vector<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>_>
    ::operator++(&local_50);
  }
  dVar6 = *(double *)(in_RDI + 0x58) * local_10;
  std::
  map<int,_std::pair<double,_double>,_std::less<int>,_std::allocator<std::pair<const_int,_std::pair<double,_double>_>_>_>
  ::~map((map<int,_std::pair<double,_double>,_std::less<int>,_std::allocator<std::pair<const_int,_std::pair<double,_double>_>_>_>
          *)0x19e556);
  std::shared_ptr<OpenMD::GenericData>::~shared_ptr((shared_ptr<OpenMD::GenericData> *)0x19e563);
  return dVar6;
}

Assistant:

RealType RestraintForceModifier::doRestraints(RealType scalingFactor) {
    std::vector<Molecule*>::const_iterator rm;
    std::shared_ptr<GenericData> data;
    Molecule::IntegrableObjectIterator ioi;
    MolecularRestraint* mRest = NULL;
    ObjectRestraint* oRest    = NULL;
    StuntDouble* sd;

    std::vector<StuntDouble*>::const_iterator ro;

    std::map<int, Restraint::RealPair> restInfo;

    unscaledPotential_ = 0.0;

    restInfo_.clear();

    for (rm = restrainedMols_.begin(); rm != restrainedMols_.end(); ++rm) {
      // make sure this molecule (*rm) has a generic data for restraints:
      data = (*rm)->getPropertyByName("Restraint");
      if (data != nullptr) {
        // make sure we can reinterpret the generic data as restraint data:
        std::shared_ptr<RestraintData> restData =
            std::dynamic_pointer_cast<RestraintData>(data);
        if (restData != nullptr) {
          // make sure we can reinterpet the restraint data as a
          // MolecularRestraint
          mRest = dynamic_cast<MolecularRestraint*>(restData->getData());
          if (mRest == NULL) {
            snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
                     "Can not cast RestraintData to MolecularRestraint\n");
            painCave.severity = OPENMD_ERROR;
            painCave.isFatal  = 1;
            simError();
          }
        } else {
          snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
                   "Can not cast GenericData to RestraintData\n");
          painCave.severity = OPENMD_ERROR;
          painCave.isFatal  = 1;
          simError();
        }
      } else {
        snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
                 "Can not find Restraint for RestrainedObject\n");
        painCave.severity = OPENMD_ERROR;
        painCave.isFatal  = 1;
        simError();
      }

      // phew.  At this point, we should have the pointer to the
      // correct MolecularRestraint in the variable mRest.

      Vector3d molCom = (*rm)->getCom();

      std::vector<Vector3d> struc;
      std::vector<Vector3d> forces;

      for (sd = (*rm)->beginIntegrableObject(ioi); sd != NULL;
           sd = (*rm)->nextIntegrableObject(ioi)) {
        struc.push_back(sd->getPos());
      }

      mRest->setScaleFactor(scalingFactor);
      mRest->calcForce(struc, molCom);
      forces    = mRest->getRestraintForces();
      int index = 0;

      for (sd = (*rm)->beginIntegrableObject(ioi); sd != NULL;
           sd = (*rm)->nextIntegrableObject(ioi)) {
        sd->addFrc(forces[index]);
        struc.push_back(sd->getPos());
        index++;
      }

      unscaledPotential_ += mRest->getUnscaledPotential();

      // only collect data on restraints that we're going to print:
      if (mRest->getPrintRestraint()) {
        restInfo = mRest->getRestraintInfo();
        restInfo_.push_back(restInfo);
      }
    }

    for (ro = restrainedObjs_.begin(); ro != restrainedObjs_.end(); ++ro) {
      // make sure this object (*ro) has a generic data for restraints:
      data = (*ro)->getPropertyByName("Restraint");
      if (data != NULL) {
        // make sure we can reinterpret the generic data as restraint data:
        std::shared_ptr<RestraintData> restData =
            std::dynamic_pointer_cast<RestraintData>(data);
        if (restData != nullptr) {
          // make sure we can reinterpet the restraint data as a pointer to
          // an ObjectRestraint:
          oRest = dynamic_cast<ObjectRestraint*>(restData->getData());
          if (oRest == NULL) {
            snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
                     "Can not cast RestraintData to ObjectRestraint\n");
            painCave.severity = OPENMD_ERROR;
            painCave.isFatal  = 1;
            simError();
          }
        } else {
          snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
                   "Can not cast GenericData to RestraintData\n");
          painCave.severity = OPENMD_ERROR;
          painCave.isFatal  = 1;
          simError();
        }
      } else {
        snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
                 "Can not find Restraint for RestrainedObject\n");
        painCave.severity = OPENMD_ERROR;
        painCave.isFatal  = 1;
        simError();
      }

      // phew.  At this point, we should have the pointer to the
      // correct Object restraint in the variable oRest.
      oRest->setScaleFactor(scalingFactor);

      Vector3d pos = (*ro)->getPos();

      if ((*ro)->isDirectional()) {
        // directional objects may have orientational restraints as well
        // as positional, so get the rotation matrix first:

        RotMat3x3d A = (*ro)->getA();
        oRest->calcForce(pos, A);
        (*ro)->addFrc(oRest->getRestraintForce());
        (*ro)->addTrq(oRest->getRestraintTorque());

      } else {
        // plain vanilla positional restraints:

        oRest->calcForce(pos);
        (*ro)->addFrc(oRest->getRestraintForce());
      }

      unscaledPotential_ += oRest->getUnscaledPotential();

      // only collect data on restraints that we're going to print:
      if (oRest->getPrintRestraint()) {
        restInfo = oRest->getRestraintInfo();
        restInfo_.push_back(restInfo);
      }
    }

    return unscaledPotential_ * scalingFactor;
  }